

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_from_euler(float roll,float pitch,float yaw)

{
  rf_quaternion rVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float z1;
  float z0;
  float y1;
  float y0;
  float x1;
  float x0;
  float yaw_local;
  float pitch_local;
  float roll_local;
  rf_quaternion q;
  
  fVar2 = cosf(roll * 0.5);
  fVar3 = sinf(roll * 0.5);
  fVar4 = cosf(pitch * 0.5);
  fVar5 = sinf(pitch * 0.5);
  fVar6 = cosf(yaw * 0.5);
  fVar7 = sinf(yaw * 0.5);
  rVar1.y = fVar2 * fVar5 * fVar6 + fVar3 * fVar4 * fVar7;
  rVar1.x = fVar3 * fVar4 * fVar6 - fVar2 * fVar5 * fVar7;
  rVar1.z = fVar2 * fVar4 * fVar7 - fVar3 * fVar5 * fVar6;
  rVar1.w = fVar2 * fVar4 * fVar6 + fVar3 * fVar5 * fVar7;
  return rVar1;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_euler(float roll, float pitch, float yaw)
{
    rf_quaternion q = {0};

    float x0 = cosf(roll * 0.5f);
    float x1 = sinf(roll * 0.5f);
    float y0 = cosf(pitch * 0.5f);
    float y1 = sinf(pitch * 0.5f);
    float z0 = cosf(yaw * 0.5f);
    float z1 = sinf(yaw * 0.5f);

    q.x = x1 * y0 * z0 - x0 * y1 * z1;
    q.y = x0 * y1 * z0 + x1 * y0 * z1;
    q.z = x0 * y0 * z1 - x1 * y1 * z0;
    q.w = x0 * y0 * z0 + x1 * y1 * z1;

    return q;
}